

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void riscv_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  uc_engine_conflict12 *uc_00;
  TCGContext_conflict11 *tcg_ctx_00;
  CPUArchState_conflict24 *env_00;
  _Bool _Var1;
  uint16_t opcode;
  int iVar2;
  target_ulong page_start;
  TCGOp *pTStack_60;
  _Bool insn_hook;
  TCGOp *prev_op;
  TCGOp *tcg_op;
  uint16_t opcode16;
  CPURISCVState_conflict2 *env;
  TCGContext_conflict11 *tcg_ctx;
  uc_struct_conflict13 *uc;
  DisasContextBase *__mptr;
  DisasContext_conflict12 *ctx;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  uc_00 = (uc_engine_conflict12 *)dcbase[2].pc_first;
  tcg_ctx_00 = (TCGContext_conflict11 *)uc_00->tcg_ctx;
  env_00 = (CPUArchState_conflict24 *)cpu->env_ptr;
  opcode = translator_lduw(tcg_ctx_00,env_00,dcbase->pc_next);
  pTStack_60 = (TCGOp *)0x0;
  iVar2 = uc_addr_is_exit(uc_00,dcbase->pc_next);
  if (iVar2 == 0) {
    _Var1 = _hook_exists_bounded(uc_00->hook[2].head,dcbase->pc_next);
    if (_Var1) {
      tcg_gen_movi_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_pc,dcbase->pc_next);
      pTStack_60 = tcg_last_op(tcg_ctx_00);
      gen_uc_tracecode(tcg_ctx_00,4,2,uc_00,dcbase->pc_next);
      check_exit_request_riscv64(tcg_ctx_00);
    }
    decode_opc(env_00,(DisasContext_conflict12 *)dcbase,opcode);
    if (_Var1) {
      if (pTStack_60 == (TCGOp *)0x0) {
        prev_op = (tcg_ctx_00->ops).tqh_first;
      }
      else {
        prev_op = (pTStack_60->link).tqe_next;
      }
      prev_op->args[1] = (long)dcbase[1].tb - dcbase->pc_next;
    }
    dcbase->pc_next = (target_ulong)dcbase[1].tb;
    if ((dcbase->is_jmp == DISAS_NEXT) &&
       (0xfff < dcbase->pc_next - (dcbase->pc_first & 0xfffffffffffff000))) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  else {
    dcbase->is_jmp = DISAS_TARGET_6;
  }
  return;
}

Assistant:

static void riscv_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPURISCVState *env = cpu->env_ptr;
    uint16_t opcode16 = translator_lduw(tcg_ctx, env, ctx->base.pc_next);
    TCGOp *tcg_op, *prev_op = NULL;
    bool insn_hook = false;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // Unicorn: We have to exit current execution here.
        dcbase->is_jmp = DISAS_UC_EXIT;
    } else {
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

            // Sync PC in advance
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);

            // save the last operand
            prev_op = tcg_last_op(tcg_ctx);
            insn_hook = true;
            gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        decode_opc(env, ctx, opcode16);

        if (insn_hook) {
            // Unicorn: patch the callback to have the proper instruction size.
            if (prev_op) {
                // As explained further up in the function where prev_op is
                // assigned, we move forward in the tail queue, so we're modifying the
                // move instruction generated by gen_uc_tracecode() that contains
                // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
                tcg_op = QTAILQ_NEXT(prev_op, link);
            } else {
                // this instruction is the first emulated code ever,
                // so the instruction operand is the first operand
                tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
            }

            tcg_op->args[1] = ctx->pc_succ_insn - ctx->base.pc_next;
        }

        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}